

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>(Benchmark *this)

{
  pointer pcVar1;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> EVar2;
  undefined8 *puVar3;
  IResultCapture *pIVar4;
  anon_class_24_3_fd67980c *fun;
  anon_class_24_3_b965e527 *fun_00;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_R8;
  IConfigPtr cfg;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
  samples;
  BenchmarkInfo info;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  plan;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> stats;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env;
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> analysis;
  Detail *local_240;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
  local_228;
  long *local_210;
  long local_208;
  long local_200 [2];
  rep local_1f0;
  int iStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  _Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
  _Stack_1d8;
  undefined8 local_1d0;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  local_1c8;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  *local_1a0;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  *local_198;
  Benchmark *local_190 [2];
  rep local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  callable *pcStack_168;
  undefined8 local_160;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  local_158;
  rep local_140;
  rep rStack_138;
  rep local_130;
  double dStack_128;
  rep local_120;
  rep rStack_118;
  rep local_110;
  double dStack_108;
  OutlierClassification local_100;
  double local_e8;
  Benchmark local_e0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_a0;
  
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::createContext();
  }
  puVar3 = (undefined8 *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  local_240 = (Detail *)*puVar3;
  local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
  if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_238 + 8) = *(int *)(local_238 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_238 + 8) = *(int *)(local_238 + 8) + 1;
    }
  }
  Detail::measure_environment<std::chrono::_V2::steady_clock>();
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[6])(pIVar4,&this->name);
  local_1a0 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)&local_240;
  local_198 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)&local_e0;
  local_190[0] = this;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_1_>
            (&local_1c8,(Benchmark *)&local_1a0,fun);
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar1,pcVar1 + (this->name)._M_string_length);
  local_1f0 = local_1c8.estimated_duration.__r;
  iStack_1e8 = local_1c8.iterations_per_sample;
  uStack_1e4 = (**(code **)(*(long *)local_240 + 0xb0))();
  local_1e0 = (**(code **)(*(long *)local_240 + 0xc0))();
  _Stack_1d8.super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
  _M_head_impl = (_Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>)
                 (_Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>)
                 local_e0.fun.f._M_t.
                 super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                 .
                 super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>
                 ._M_head_impl;
  local_1d0 = local_e0.name.field_2._8_8_;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[7])(pIVar4,&local_210);
  local_1a0 = &local_1c8;
  local_198 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)&local_240;
  local_190[0] = &local_e0;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_2_>
            (&local_228,(Benchmark *)&local_1a0,fun_00);
  EVar2.clock_resolution.outliers._0_8_ = local_e0.name._M_dataplus._M_p;
  EVar2.clock_resolution.mean.__r =
       (rep)local_e0.fun.f._M_t.
            super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
            .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
            _M_head_impl;
  EVar2.clock_resolution.outliers.low_mild = (undefined4)local_e0.name._M_string_length;
  EVar2.clock_resolution.outliers.high_mild = local_e0.name._M_string_length._4_4_;
  EVar2.clock_resolution._24_8_ = local_e0.name.field_2._M_allocated_capacity;
  EVar2.clock_cost.mean.__r = (rep)local_e0.name.field_2._8_8_;
  EVar2.clock_cost.outliers.samples_seen = (undefined4)uStack_b8;
  EVar2.clock_cost.outliers.low_severe = uStack_b8._4_4_;
  EVar2.clock_cost.outliers.low_mild = (undefined4)local_b0;
  EVar2.clock_cost.outliers.high_mild = local_b0._4_4_;
  EVar2.clock_cost._24_8_ = uStack_a8;
  Detail::
  analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
            (&local_a0,local_240,
             (IConfig *)
             local_228.
             super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,EVar2,
             (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
              )local_228.
               super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,in_R8);
  local_1a0 = (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
               *)local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_210,local_208 + (long)local_210);
  local_160 = local_1d0;
  uStack_178 = CONCAT44(uStack_1e4,iStack_1e8);
  local_170 = CONCAT44(uStack_1dc,local_1e0);
  pcStack_168 = (callable *)
                _Stack_1d8.
                super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>
                ._M_head_impl;
  local_180 = local_1f0;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector(&local_158,&local_a0.samples);
  local_130 = local_a0.mean.upper_bound.__r;
  dStack_128 = local_a0.mean.confidence_interval;
  local_140 = local_a0.mean.point.__r;
  rStack_138 = local_a0.mean.lower_bound.__r;
  local_120 = local_a0.standard_deviation.point.__r;
  rStack_118 = local_a0.standard_deviation.lower_bound.__r;
  local_110 = local_a0.standard_deviation.upper_bound.__r;
  dStack_108 = local_a0.standard_deviation.confidence_interval;
  local_100.samples_seen = local_a0.outliers.samples_seen;
  local_100.low_severe = local_a0.outliers.low_severe;
  local_100.low_mild = local_a0.outliers.low_mild;
  local_100.high_mild = local_a0.outliers.high_mild;
  local_100.high_severe = local_a0.outliers.high_severe;
  local_e8 = local_a0.outlier_variance;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[8])(pIVar4,&local_1a0);
  if (local_158.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0 !=
      (CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
       *)local_190) {
    operator_delete(local_1a0,
                    (ulong)((long)&(local_190[0]->fun).f._M_t.
                                   super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
                                   .
                                   super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>
                                   ._M_head_impl + 1));
  }
  if (local_a0.samples.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.samples.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.samples.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.samples.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_1c8.benchmark.f._M_t.
      super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
      .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_1c8.benchmark.f._M_t.
        super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
        _M_head_impl)[3])();
  }
  if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
  }
  return;
}

Assistant:

void run() {
                IConfigPtr cfg = getCurrentContext().getConfig();

                auto env = Detail::measure_environment<Clock>();

                getResultCapture().benchmarkPreparing(name);
                CATCH_TRY{
                    auto plan = user_code([&] {
                        return prepare<Clock>(*cfg, env);
                    });

                    BenchmarkInfo info {
                        name,
                        plan.estimated_duration.count(),
                        plan.iterations_per_sample,
                        cfg->benchmarkSamples(),
                        cfg->benchmarkResamples(),
                        env.clock_resolution.mean.count(),
                        env.clock_cost.mean.count()
                    };

                    getResultCapture().benchmarkStarting(info);

                    auto samples = user_code([&] {
                        return plan.template run<Clock>(*cfg, env);
                    });

                    auto analysis = Detail::analyse(*cfg, env, samples.begin(), samples.end());
                    BenchmarkStats<FloatDuration<Clock>> stats{ info, analysis.samples, analysis.mean, analysis.standard_deviation, analysis.outliers, analysis.outlier_variance };
                    getResultCapture().benchmarkEnded(stats);

                }